

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::deepCopy(Buffer *this,Buffer *that)

{
  long lVar1;
  ulong uVar2;
  char *__dest;
  char *__src;
  ulong uVar3;
  
  if (this != that) {
    if (that->leftIndex_ != that->rightIndex_) {
      if (this->buffer_ != (char *)0x0) {
        operator_delete__(this->buffer_);
        this->buffer_ = (char *)0x0;
      }
      uVar2 = that->rightIndex_ - that->leftIndex_;
      if (that->leftIndex_ <= that->rightIndex_) {
        this->capacity_ = uVar2;
        uVar3 = 0xffffffffffffffff;
        if (-1 < (long)uVar2) {
          uVar3 = uVar2;
        }
        __dest = (char *)operator_new__(uVar3);
        this->buffer_ = __dest;
        __src = data(that);
        lVar1 = that->rightIndex_;
        if (that->leftIndex_ <= lVar1) {
          memcpy(__dest,__src,lVar1 - that->leftIndex_);
          this->leftIndex_ = 0;
          if (that->leftIndex_ <= lVar1) {
            this->rightIndex_ = lVar1 - that->leftIndex_;
            return;
          }
        }
      }
      __assert_fail("rightIndex_ >= leftIndex_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                    ,0x5a,"off_t Liby::Buffer::size() const");
    }
    this->leftIndex_ = 0;
    this->rightIndex_ = 0;
  }
  return;
}

Assistant:

void Buffer::deepCopy(const Buffer &that) {
    if (this == &that)
        return;
    if(that.empty()) {
        retrieve();
        return;
    }
    resetBuffer();
    capacity_ = that.size() + defaultPrependSize;
    buffer_ = new char[capacity_];
    ::memcpy(buffer_ + defaultPrependSize, that.data(), that.size());
    leftIndex_ = defaultPrependSize;
    rightIndex_ = that.size() + defaultPrependSize;
}